

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraClaus.c
# Opt level: O0

int Fra_ClausBmcClauses(Clu_Man_t *p)

{
  int *piVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  lit lVar5;
  int iVar6;
  int *piVar7;
  int local_38;
  int local_34;
  int f;
  int k;
  int i;
  int Counter;
  int End;
  int Beg;
  int RetValue;
  int nLitsTot;
  int *pStart;
  Clu_Man_t *p_local;
  
  k = 0;
  if (p->nPref != 0) {
    iVar3 = p->nPref;
    iVar4 = p->pCnf->nVars;
    for (f = 0; iVar2 = Vec_IntSize(p->vLits), f < iVar2; f = f + 1) {
      piVar7 = p->vLits->pArray;
      piVar7[f] = iVar3 * 2 * iVar4 + piVar7[f];
    }
  }
  iVar3 = p->pCnf->nVars * 2;
  piVar7 = Vec_IntArray(p->vLits);
  local_38 = 0;
  do {
    if (p->nFrames <= local_38) {
      iVar4 = p->nPref;
      iVar2 = p->nFrames;
      for (f = 0; iVar6 = Vec_IntSize(p->vLits), f < iVar6; f = f + 1) {
        piVar7 = p->vLits->pArray;
        piVar7[f] = piVar7[f] - (iVar4 + iVar2) * iVar3;
      }
      return k;
    }
    Counter = 0;
    for (f = 0; iVar4 = Vec_IntSize(p->vClauses), f < iVar4; f = f + 1) {
      iVar4 = Vec_IntEntry(p->vClauses,f);
      iVar2 = Vec_IntEntry(p->vCosts,f);
      if (iVar2 != -1) {
        iVar2 = Vec_IntEntry(p->vCosts,f);
        if (iVar2 < 1) {
          __assert_fail("Vec_IntEntry( p->vCosts, i ) > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraClaus.c"
                        ,0x39f,"int Fra_ClausBmcClauses(Clu_Man_t *)");
        }
        if (p->nLutSize < iVar4 - Counter) {
          __assert_fail("End - Beg <= p->nLutSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraClaus.c"
                        ,0x3a0,"int Fra_ClausBmcClauses(Clu_Man_t *)");
        }
        for (local_34 = Counter; local_34 < iVar4; local_34 = local_34 + 1) {
          lVar5 = lit_neg(piVar7[local_34]);
          piVar7[local_34] = lVar5;
        }
        iVar2 = sat_solver_solve(p->pSatBmc,piVar7 + Counter,piVar7 + iVar4,(long)p->nBTLimit,0,0,0)
        ;
        for (local_34 = Counter; local_34 < iVar4; local_34 = local_34 + 1) {
          lVar5 = lit_neg(piVar7[local_34]);
          piVar7[local_34] = lVar5;
        }
        if (iVar2 == -1) {
          if (p->pSatBmc->qtail != p->pSatBmc->qhead) {
            iVar2 = sat_solver_simplify(p->pSatBmc);
            if (iVar2 == 0) {
              __assert_fail("RetValue != 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraClaus.c"
                            ,0x3bf,"int Fra_ClausBmcClauses(Clu_Man_t *)");
            }
            if (p->pSatBmc->qtail != p->pSatBmc->qhead) {
              __assert_fail("p->pSatBmc->qtail == p->pSatBmc->qhead",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/fra/fraClaus.c"
                            ,0x3c0,"int Fra_ClausBmcClauses(Clu_Man_t *)");
            }
          }
        }
        else {
          Vec_IntWriteEntry(p->vCosts,f,-1);
          k = k + 1;
        }
      }
      Counter = iVar4;
    }
    for (f = 0; iVar4 = Vec_IntSize(p->vLits), f < iVar4; f = f + 1) {
      piVar1 = p->vLits->pArray;
      piVar1[f] = iVar3 + piVar1[f];
    }
    local_38 = local_38 + 1;
  } while( true );
}

Assistant:

int Fra_ClausBmcClauses( Clu_Man_t * p )
{
    int * pStart, nLitsTot, RetValue, Beg, End, Counter, i, k, f;
/*
    for ( i = 0; i < Vec_IntSize(p->vLits); i++ )
        printf( "%d ", p->vLits->pArray[i] );
    printf( "\n" );
*/
    // add the clauses
    Counter = 0;
    // skip through the prefix variables
    if ( p->nPref )
    {
        nLitsTot = p->nPref * 2 * p->pCnf->nVars;
        for ( i = 0; i < Vec_IntSize(p->vLits); i++ )
            p->vLits->pArray[i] += nLitsTot;
    }
    // go through the timeframes
    nLitsTot = 2 * p->pCnf->nVars;
    pStart = Vec_IntArray(p->vLits);
    for ( f = 0; f < p->nFrames; f++ )
    {
        Beg = 0;
        Vec_IntForEachEntry( p->vClauses, End, i )
        {
            if ( Vec_IntEntry( p->vCosts, i ) == -1 )
            {
                Beg = End;
                continue;
            }
            assert( Vec_IntEntry( p->vCosts, i ) > 0 );
            assert( End - Beg <= p->nLutSize );

            for ( k = Beg; k < End; k++ )
                pStart[k] = lit_neg( pStart[k] );
            RetValue = sat_solver_solve( p->pSatBmc, pStart + Beg, pStart + End, (ABC_INT64_T)p->nBTLimit, (ABC_INT64_T)0, (ABC_INT64_T)0, (ABC_INT64_T)0 );
            for ( k = Beg; k < End; k++ )
                pStart[k] = lit_neg( pStart[k] );

            if ( RetValue != l_False )
            {
                Beg = End;
                Vec_IntWriteEntry( p->vCosts, i, -1 );
                Counter++;
                continue;
            }
/*
            // add the clause
            RetValue = sat_solver_addclause( p->pSatBmc, pStart + Beg, pStart + End );
    //        assert( RetValue == 1 );
            if ( RetValue == 0 )
            {
                printf( "Error: Solver is UNSAT after adding BMC clauses.\n" );
                return -1;
            }
*/
            Beg = End;

            // simplify the solver
            if ( p->pSatBmc->qtail != p->pSatBmc->qhead )
            {
                RetValue = sat_solver_simplify(p->pSatBmc);
                assert( RetValue != 0 );
                assert( p->pSatBmc->qtail == p->pSatBmc->qhead );
            }
        }
        // increment literals
        for ( i = 0; i < Vec_IntSize(p->vLits); i++ )
            p->vLits->pArray[i] += nLitsTot;
    }

    // return clauses back to normal
    nLitsTot = (p->nPref + p->nFrames) * nLitsTot;
    for ( i = 0; i < Vec_IntSize(p->vLits); i++ )
        p->vLits->pArray[i] -= nLitsTot;
/*
    for ( i = 0; i < Vec_IntSize(p->vLits); i++ )
        printf( "%d ", p->vLits->pArray[i] );
    printf( "\n" );
*/
    return Counter;
}